

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  double *pdVar2;
  ostream *poVar3;
  long lVar4;
  undefined1 auVar5 [16];
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar6;
  vector<double,_std::allocator<double>_> distances;
  double distance;
  double *local_48;
  iterator iStack_40;
  double *local_38;
  double local_28;
  double local_20;
  
  local_48 = (double *)0x0;
  iStack_40._M_current = (double *)0x0;
  local_38 = (double *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter distances between city A and B separated by \'space\'. ",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To terminate input enter \'.\' and press \'enter\':\n",0x30);
  local_20 = 0.0;
  while (piVar1 = std::istream::_M_extract<double>((double *)&std::cin),
        ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    if (iStack_40._M_current == local_38) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_48,iStack_40,&local_20);
    }
    else {
      *iStack_40._M_current = local_20;
      iStack_40._M_current = iStack_40._M_current + 1;
    }
  }
  local_28 = 0.0;
  for (pdVar2 = local_48; pdVar2 != iStack_40._M_current; pdVar2 = pdVar2 + 1) {
    local_28 = local_28 + *pdVar2;
  }
  pVar6 = std::
          __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total distance: ",0x10);
  poVar3 = std::ostream::_M_insert<double>(local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nThe smallest distance: ",0x18);
  poVar3 = std::ostream::_M_insert<double>(*pVar6.first._M_current._M_current);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nThe biggest distance: ",0x17);
  poVar3 = std::ostream::_M_insert<double>(*pVar6.second._M_current._M_current);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nThe mean distance: ",0x14);
  lVar4 = (long)iStack_40._M_current - (long)local_48 >> 3;
  auVar5._8_4_ = (int)((long)iStack_40._M_current - (long)local_48 >> 0x23);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (local_28 /
             ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)));
  if (local_48 != (double *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return 0;
}

Assistant:

int main()
{
	std::vector<double> distances;
	std::cout << "Enter distances between city A and B separated by 'space'. "
			  << "To terminate input enter '.' and press 'enter':\n";
	for (double distance = 0; std::cin >> distance;)
	{
		distances.push_back(distance);
	}
	auto sum = std::accumulate(distances.begin(), distances.end(), 0.0);
	auto [min, max] = std::minmax_element(distances.begin(), distances.end());
	std::cout << "Total distance: "
			  << sum
			  << "\nThe smallest distance: " << *min
			  << "\nThe biggest distance: " << *max
			  << "\nThe mean distance: " << sum / distances.size();
	return 0;
}